

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::SynchronizeDifferential(ManchesterAnalyzer *this)

{
  U64 location;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  uint local_70;
  U32 i;
  U32 count;
  undefined1 local_48 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  bool last_bit_one;
  U64 edge_distance;
  U64 next_edge_location;
  U64 edge_location;
  ManchesterAnalyzer *this_local;
  
  edge_location = (U64)this;
  while( true ) {
    while( true ) {
      if ((this->mSynchronized & 1U) != 0) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      next_edge_location = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      location = AnalyzerChannelData::GetSampleNumber();
      uVar1 = location - next_edge_location;
      if ((uVar1 <= this->mT - this->mTError) || (this->mT + this->mTError <= uVar1)) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&next_edge_location);
    }
    if ((this->mT * 2 - this->mTError < uVar1) && (uVar1 < this->mT * 2 + this->mTError)) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&next_edge_location);
  this->mSynchronized = true;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    (&this->mUnsyncedLocations);
  if ((sVar2 & 1) == 1) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  while (sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                           (&this->mUnsyncedLocations), sVar2 != 0) {
    pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                       (&this->mUnsyncedLocations);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48,pvVar3);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
              (&this->mUnsyncedLocations);
    sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      (&this->mUnsyncedLocations);
    if (sVar2 != 0) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
                (&this->mUnsyncedLocations);
    }
  }
  __first = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  __last = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::end
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
            ((__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__last._M_current);
  sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  for (local_70 = 0; local_70 < (uint)sVar2; local_70 = local_70 + 1) {
    if ((local_70 == 0) &&
       ((locations_to_save.
         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 1)) {
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_48,0);
      SaveBit(this,*pvVar3,1);
    }
    else {
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_48,(ulong)local_70);
      SaveBit(this,*pvVar3,0);
    }
  }
  SaveBit(this,location,1);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeDifferential()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;

            bool last_bit_one = false;
            if( mUnsyncedLocations.size() % 2 == 1 )
                last_bit_one = true;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( ( i == 0 ) && ( last_bit_one == true ) )
                    SaveBit( locations_to_save[ i ], 1 );
                else
                    SaveBit( locations_to_save[ i ], 0 );
            }

            SaveBit( next_edge_location, 1 );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}